

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUMagCal.cpp
# Opt level: O1

void __thiscall RTIMUMagCal::newMinMaxData(RTIMUMagCal *this,RTVector3 *data)

{
  RTFLOAT *pRVar1;
  float fVar2;
  int i;
  long lVar3;
  
  if (0 < this->m_startCount) {
    this->m_startCount = this->m_startCount + -1;
    return;
  }
  lVar3 = 0;
  do {
    if (data->m_data[lVar3] < (this->m_magMin).m_data[lVar3]) {
      (this->m_magMin).m_data[lVar3] = data->m_data[lVar3];
    }
    fVar2 = data->m_data[lVar3];
    pRVar1 = (this->m_magMax).m_data + lVar3;
    if (*pRVar1 <= fVar2 && fVar2 != *pRVar1) {
      (this->m_magMax).m_data[lVar3] = fVar2;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  return;
}

Assistant:

void RTIMUMagCal::newMinMaxData(const RTVector3& data)
{
    if (m_startCount > 0) {
        m_startCount--;
        return;
    }

    for (int i = 0; i < 3; i++) {
        if (m_magMin.data(i) > data.data(i)) {
            m_magMin.setData(i, data.data(i));
        }

        if (m_magMax.data(i) < data.data(i)) {
            m_magMax.setData(i, data.data(i));
        }
    }
}